

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauCanon.c
# Opt level: O3

int Abc_TtScc(word *pTruth,int nVars)

{
  undefined1 auVar1 [16];
  uint uVar2;
  byte bVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  int *piVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  ulong uVar15;
  long lVar20;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  int iVar19;
  int iVar21;
  undefined1 auVar18 [16];
  int iVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  
  bVar3 = (byte)nVars;
  uVar2 = 1 << (bVar3 - 6 & 0x1f);
  if (nVars < 7) {
    uVar2 = 1;
  }
  if (nVars < 6) {
    uVar5 = 1 << (bVar3 & 0x1f);
    uVar15 = (ulong)uVar5;
    uVar8 = ~(-1L << ((byte)uVar5 & 0x3f)) & *pTruth;
    *pTruth = uVar8;
    if ((uint)nVars < 6) {
      uVar4 = uVar5 * 2;
      uVar7 = (ulong)uVar4;
      uVar6 = 0x40;
      if (0x40 < uVar7) {
        uVar6 = uVar7;
      }
      uVar7 = ((uVar6 - uVar7) - (ulong)(nVars != 5) >> (bVar3 & 0x3f)) + (ulong)(nVars != 5);
      lVar20 = (ulong)uVar5 * 2;
      auVar10._8_8_ = 0;
      auVar10._0_8_ = uVar8;
      auVar13._8_4_ = (int)uVar7;
      auVar13._0_8_ = uVar7;
      auVar13._12_4_ = (int)(uVar7 >> 0x20);
      uVar6 = 0xfffffffffffffffe;
      do {
        auVar11 = auVar10;
        auVar17._8_4_ = (int)uVar8;
        auVar17._0_8_ = uVar8;
        auVar17._12_4_ = (int)(uVar8 >> 0x20);
        auVar12._8_8_ = auVar17._8_8_ << lVar20;
        auVar12._0_8_ = uVar8 << uVar15;
        auVar10 = auVar12 | auVar11;
        uVar15 = uVar15 + uVar4;
        lVar20 = lVar20 + (ulong)uVar4;
        uVar6 = uVar6 + 2;
      } while ((uVar7 & 0xfffffffffffffffe) != uVar6);
      auVar16._8_4_ = (int)uVar6;
      auVar16._0_8_ = uVar6;
      auVar16._12_4_ = (int)(uVar6 >> 0x20);
      auVar13 = auVar13 ^ _DAT_0093d220;
      auVar17 = (auVar16 | _DAT_0093d210) ^ _DAT_0093d220;
      iVar22 = -(uint)(auVar13._0_4_ < auVar17._0_4_);
      iVar23 = -(uint)(auVar13._4_4_ < auVar17._4_4_);
      iVar24 = -(uint)(auVar13._8_4_ < auVar17._8_4_);
      iVar25 = -(uint)(auVar13._12_4_ < auVar17._12_4_);
      iVar19 = -(uint)(auVar17._4_4_ == auVar13._4_4_);
      iVar21 = -(uint)(auVar17._12_4_ == auVar13._12_4_);
      auVar14._4_4_ = iVar19;
      auVar14._0_4_ = iVar19;
      auVar14._8_4_ = iVar21;
      auVar14._12_4_ = iVar21;
      auVar1._4_4_ = iVar22;
      auVar1._0_4_ = iVar22;
      auVar1._8_4_ = iVar24;
      auVar1._12_4_ = iVar24;
      auVar18._4_4_ = iVar23;
      auVar18._0_4_ = iVar23;
      auVar18._8_4_ = iVar25;
      auVar18._12_4_ = iVar25;
      auVar18 = auVar18 | auVar14 & auVar1;
      auVar10 = ~auVar18 & auVar10 | auVar11 & auVar18;
      *pTruth = auVar10._8_8_ | auVar10._0_8_;
    }
  }
  if ((int)uVar2 < 1) {
    iVar19 = 0;
  }
  else {
    uVar15 = 0;
    iVar19 = 0;
    do {
      iVar21 = 0;
      if (pTruth[uVar15] != 0) {
        uVar8 = 0;
        piVar9 = Abc_TtCountOnesInCofsFast6_rec::bit_count;
        iVar21 = 0;
        do {
          if ((pTruth[uVar15] >> (uVar8 & 0x3f) & 1) != 0) {
            iVar21 = iVar21 + (1 << ((char)*piVar9 +
                                     (char)Abc_TtCountOnesInCofsFast6_rec::bit_count
                                           [uVar15 >> 8 & 0xffffff] +
                                     (char)Abc_TtCountOnesInCofsFast6_rec::bit_count[uVar15 & 0xff]
                                    & 0x1fU));
          }
          uVar8 = uVar8 + 1;
          piVar9 = piVar9 + 1;
        } while (uVar8 != 0x40);
      }
      iVar19 = iVar19 + iVar21;
      uVar15 = uVar15 + 1;
    } while (uVar15 != uVar2);
  }
  return iVar19;
}

Assistant:

int Abc_TtScc(word * pTruth, int nVars)
{
    int k, nWords = Abc_TtWordNum(nVars);
    int sum = 0;
    Abc_TtNormalizeSmallTruth(pTruth, nVars);
    for (k = 0; k < nWords; k++)
        sum += Abc_TtScc6(pTruth[k], Abc_TtBitCount16(k));
    return sum;
}